

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O0

LogStream *
Assimp::LogStream::createDefaultStream(aiDefaultLogStream streams,char *name,IOSystem *io)

{
  StdOStreamLogStream *local_70;
  IOSystem *io_local;
  char *name_local;
  StdOStreamLogStream *pSStack_10;
  aiDefaultLogStream streams_local;
  
  switch(streams) {
  case aiDefaultLogStream_FILE:
    if ((name == (char *)0x0) || (*name == '\0')) {
      local_70 = (StdOStreamLogStream *)0x0;
    }
    else {
      local_70 = (StdOStreamLogStream *)
                 Intern::AllocateFromAssimpHeap::operator_new
                           ((AllocateFromAssimpHeap *)0x10,(size_t)name);
      FileLogStream::FileLogStream((FileLogStream *)local_70,name,io);
    }
    pSStack_10 = local_70;
    break;
  case aiDefaultLogStream_STDOUT:
    pSStack_10 = (StdOStreamLogStream *)
                 Intern::AllocateFromAssimpHeap::operator_new
                           ((AllocateFromAssimpHeap *)0x10,(size_t)name);
    StdOStreamLogStream::StdOStreamLogStream(pSStack_10,(ostream *)&std::cout);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/DefaultLogger.cpp"
                  ,0x77,
                  "static LogStream *Assimp::LogStream::createDefaultStream(aiDefaultLogStream, const char *, IOSystem *)"
                 );
  case aiDefaultLogStream_STDERR:
    pSStack_10 = (StdOStreamLogStream *)
                 Intern::AllocateFromAssimpHeap::operator_new
                           ((AllocateFromAssimpHeap *)0x10,(size_t)name);
    StdOStreamLogStream::StdOStreamLogStream(pSStack_10,(ostream *)&std::cerr);
    break;
  case aiDefaultLogStream_DEBUGGER:
    pSStack_10 = (StdOStreamLogStream *)0x0;
  }
  return &pSStack_10->super_LogStream;
}

Assistant:

LogStream* LogStream::createDefaultStream(aiDefaultLogStream    streams,
    const char* name /*= "AssimpLog.txt"*/,
    IOSystem* io            /*= NULL*/)
{
    switch (streams)
    {
        // This is a platform-specific feature
    case aiDefaultLogStream_DEBUGGER:
#ifdef WIN32
        return new Win32DebugLogStream();
#else
        return nullptr;
#endif

    // Platform-independent default streams
    case aiDefaultLogStream_STDERR:
        return new StdOStreamLogStream(std::cerr);
    case aiDefaultLogStream_STDOUT:
        return new StdOStreamLogStream(std::cout);
    case aiDefaultLogStream_FILE:
        return (name && *name ? new FileLogStream(name,io) : nullptr );
    default:
        // We don't know this default log stream, so raise an assertion
        ai_assert(false);

    };

    // For compilers without dead code path detection
    return nullptr;
}